

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fRasterizationTests.cpp
# Opt level: O1

void __thiscall
deqp::gles2::Functional::anon_unknown_1::FillRuleCase::FillRuleCase
          (FillRuleCase *this,Context *ctx,char *name,char *desc,FillRuleCaseType type)

{
  int iVar1;
  bool bVar2;
  
  (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_02173a28;
  tcu::TestCase::TestCase((TestCase *)this,ctx->m_testCtx,name,"Verify fill rules");
  bVar2 = ((FillRuleCaseType)desc & ~FILLRULECASE_REVERSED) == FILLRULECASE_CLIPPED_FULL;
  iVar1 = 0x100;
  if (bVar2) {
    iVar1 = 0x40;
  }
  (this->super_BaseRenderingCase).super_TestCase.m_context = ctx;
  (this->super_BaseRenderingCase).m_renderSize = iVar1;
  (this->super_BaseRenderingCase).m_numSamples = -1;
  (this->super_BaseRenderingCase).m_subpixelBits = -1;
  *(undefined1 **)&(this->super_BaseRenderingCase).m_pointSize = &DAT_3f8000003f800000;
  (this->super_BaseRenderingCase).m_shader = (ShaderProgram *)0x0;
  (this->super_BaseRenderingCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__FillRuleCase_02173a28;
  this->m_caseType = (FillRuleCaseType)desc;
  this->m_iteration = 0;
  iVar1 = 2;
  if (bVar2) {
    iVar1 = 0xf;
  }
  this->m_iterationCount = iVar1;
  this->m_allIterationsPassed = true;
  return;
}

Assistant:

FillRuleCase::FillRuleCase (Context& ctx, const char* name, const char* desc, FillRuleCaseType type)
	: BaseRenderingCase		(ctx, name, desc, getRenderSize(type))
	, m_caseType			(type)
	, m_iteration			(0)
	, m_iterationCount		(getNumIterations(type))
	, m_allIterationsPassed	(true)
{
	DE_ASSERT(type < FILLRULECASE_LAST);
}